

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O3

void __thiscall QTreeView::setModel(QTreeView *this,QAbstractItemModel *model)

{
  long lVar1;
  QAbstractItemModel *pQVar2;
  void **ppvVar3;
  void **ppvVar4;
  void *pvVar5;
  int iVar6;
  SortOrder SVar7;
  QAbstractItemModel *pQVar8;
  undefined4 *puVar9;
  long lVar10;
  unsigned_long __i0;
  long in_FS_OFFSET;
  code *local_78;
  ImplFn local_70;
  code *local_68;
  ImplFn local_60;
  code *local_58;
  undefined8 local_50;
  Connection local_48;
  QObject local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  pQVar2 = *(QAbstractItemModel **)(lVar1 + 0x2f8);
  if (pQVar2 != model) {
    if ((pQVar2 != (QAbstractItemModel *)0x0) &&
       (pQVar8 = (QAbstractItemModel *)QAbstractItemModelPrivate::staticEmptyModel(),
       pQVar2 != pQVar8)) {
      lVar10 = 0;
      do {
        QObject::disconnect((Connection *)(lVar1 + 0x640 + lVar10));
        lVar10 = lVar10 + 8;
      } while (lVar10 != 0x10);
    }
    if (((*(long *)(lVar1 + 800) != 0) && (*(int *)(*(long *)(lVar1 + 800) + 4) != 0)) &&
       (*(long *)(lVar1 + 0x328) != 0)) {
      QObject::disconnect((Connection *)(lVar1 + 0x638));
    }
    QList<QTreeViewItem>::clear((QList<QTreeViewItem> *)(lVar1 + 0x5a0));
    QHash<QPersistentModelIndex,_QHashDummyValue>::clear
              ((QHash<QPersistentModelIndex,_QHashDummyValue> *)(lVar1 + 0x5d8));
    QHash<QPersistentModelIndex,_QHashDummyValue>::clear
              ((QHash<QPersistentModelIndex,_QHashDummyValue> *)(lVar1 + 0x5e8));
    *(undefined1 *)(lVar1 + 0x624) = 1;
    (**(code **)(**(long **)(lVar1 + 0x590) + 0x1c8))(*(long **)(lVar1 + 0x590),model);
    *(undefined1 *)(lVar1 + 0x624) = 0;
    QAbstractItemView::setModel((QAbstractItemView *)this,model);
    if (*(QObject **)(lVar1 + 0x2f8) != (QObject *)0x0) {
      local_58 = QAbstractItemModel::rowsRemoved;
      lVar10 = 0;
      local_50 = 0;
      local_68 = (code *)0xc1;
      local_60 = (ImplFn)0x0;
      QObject::disconnectImpl
                (*(QObject **)(lVar1 + 0x2f8),&local_58,*(QObject **)(lVar1 + 8),&local_68,
                 (QMetaObject *)&QAbstractItemModel::staticMetaObject);
      local_58 = QAbstractItemModel::layoutChanged;
      local_50 = 0;
      local_68 = (code *)0xf1;
      local_60 = (ImplFn)0x0;
      QObject::disconnectImpl
                (*(QObject **)(lVar1 + 0x2f8),&local_58,
                 *(QObject **)(*(long *)(*(long *)(lVar1 + 0x590) + 8) + 8),&local_68,
                 (QMetaObject *)&QAbstractItemModel::staticMetaObject);
      ppvVar3 = *(void ***)(lVar1 + 0x2f8);
      local_78 = rowsRemoved;
      local_70 = (ImplFn)0x0;
      local_58 = QAbstractItemModel::rowsRemoved;
      local_50 = 0;
      puVar9 = (undefined4 *)operator_new(0x20);
      *puVar9 = 1;
      *(code **)(puVar9 + 2) =
           QtPrivate::
           QCallableObject<void_(QTreeView::*)(const_QModelIndex_&,_int,_int),_QtPrivate::List<const_QModelIndex_&,_int,_int>,_void>
           ::impl;
      *(code **)(puVar9 + 4) = rowsRemoved;
      *(undefined8 *)(puVar9 + 6) = 0;
      QObject::connectImpl
                ((QObject *)&local_48,ppvVar3,(QObject *)&local_58,(void **)this,
                 (QSlotObjectBase *)&local_78,(ConnectionType)puVar9,(int *)0x0,(QMetaObject *)0x0);
      ppvVar3 = *(void ***)(lVar1 + 0x2f8);
      local_58 = QAbstractItemModel::modelAboutToBeReset;
      local_50 = 0;
      local_68 = QTreeViewPrivate::modelAboutToBeReset;
      local_60 = (ImplFn)0x0;
      ppvVar4 = *(void ***)(lVar1 + 8);
      puVar9 = (undefined4 *)operator_new(0x20);
      *puVar9 = 1;
      *(code **)(puVar9 + 2) =
           QtPrivate::QPrivateSlotObject<void_(QTreeViewPrivate::*)(),_QtPrivate::List<>,_void>::
           impl;
      *(code **)(puVar9 + 4) = QTreeViewPrivate::modelAboutToBeReset;
      *(undefined8 *)(puVar9 + 6) = 0;
      QObject::connectImpl
                (local_40,ppvVar3,(QObject *)&local_58,ppvVar4,(QSlotObjectBase *)&local_68,
                 (ConnectionType)puVar9,(int *)0x0,(QMetaObject *)0x0);
      do {
        pvVar5 = *(void **)(lVar1 + 0x640 + lVar10 * 8);
        *(void **)(lVar1 + 0x640 + lVar10 * 8) = (&local_48)[lVar10].d_ptr;
        (&local_48)[lVar10].d_ptr = pvVar5;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 2);
      lVar10 = 8;
      do {
        QMetaObject::Connection::~Connection((Connection *)((long)&local_48.d_ptr + lVar10));
        lVar10 = lVar10 + -8;
      } while (lVar10 != -8);
    }
    if (*(char *)(lVar1 + 0x5c3) == '\x01') {
      iVar6 = QHeaderView::sortIndicatorSection
                        (*(QHeaderView **)
                          (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                     super_QFrame.super_QWidget.field_0x8 + 0x590));
      SVar7 = QHeaderView::sortIndicatorOrder
                        (*(QHeaderView **)
                          (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                     super_QFrame.super_QWidget.field_0x8 + 0x590));
      (**(code **)(**(long **)(lVar1 + 0x2f8) + 0x140))(*(long **)(lVar1 + 0x2f8),iVar6,SVar7);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeView::setModel(QAbstractItemModel *model)
{
    Q_D(QTreeView);
    if (model == d->model)
        return;
    if (d->model && d->model != QAbstractItemModelPrivate::staticEmptyModel()) {
        for (const QMetaObject::Connection &connection : d->modelConnections)
            QObject::disconnect(connection);
    }

    if (d->selectionModel) { // support row editing
        QObject::disconnect(d->selectionmodelConnection);
    }
    d->viewItems.clear();
    d->expandedIndexes.clear();
    d->hiddenIndexes.clear();
    d->geometryRecursionBlock = true;   // do not update geometries due to signals from the headers
    d->header->setModel(model);
    d->geometryRecursionBlock = false;
    QAbstractItemView::setModel(model);

    if (d->model) {
        // QAbstractItemView connects to a private slot
        QObjectPrivate::disconnect(d->model, &QAbstractItemModel::rowsRemoved,
                                   d, &QAbstractItemViewPrivate::rowsRemoved);
        // do header layout after the tree
        QObjectPrivate::disconnect(d->model, &QAbstractItemModel::layoutChanged,
                                   d->header->d_func(), &QAbstractItemViewPrivate::layoutChanged);

        d->modelConnections = {
            // QTreeView has a public slot for this
            QObject::connect(d->model, &QAbstractItemModel::rowsRemoved,
                             this, &QTreeView::rowsRemoved),
            QObjectPrivate::connect(d->model, &QAbstractItemModel::modelAboutToBeReset,
                                    d, &QTreeViewPrivate::modelAboutToBeReset)
        };
    }
    if (d->sortingEnabled)
        d->sortIndicatorChanged(header()->sortIndicatorSection(), header()->sortIndicatorOrder());
}